

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Hash_MD5.c
# Opt level: O0

void Hacl_Hash_MD5_digest(Hacl_Streaming_MD_state_32 *state,uint8_t *output)

{
  uint32_t *puVar1;
  ulong uVar2;
  long lVar3;
  uint64_t prev_len_last;
  uint8_t *buf_multi;
  uint8_t *buf_last;
  undefined8 uStack_68;
  uint32_t ite;
  uint32_t tmp_block_state [4];
  uint8_t *buf_1;
  uint32_t r;
  uint64_t total_len;
  uint8_t *buf_;
  uint32_t *block_state;
  Hacl_Streaming_MD_state_32 scrut;
  uint8_t *output_local;
  Hacl_Streaming_MD_state_32 *state_local;
  
  puVar1 = state->block_state;
  tmp_block_state._8_8_ = state->buf;
  uVar2 = state->total_len;
  if (((uVar2 & 0x3f) == 0) && (uVar2 != 0)) {
    buf_1._4_4_ = 0x40;
  }
  else {
    buf_1._4_4_ = (uint)uVar2 & 0x3f;
  }
  memset(&stack0xffffffffffffff98,0,0x10);
  uStack_68 = *(undefined8 *)puVar1;
  tmp_block_state._0_8_ = *(undefined8 *)(puVar1 + 2);
  if (((buf_1._4_4_ & 0x3f) == 0) && (buf_1._4_4_ != 0)) {
    buf_last._4_4_ = 0x40;
  }
  else {
    buf_last._4_4_ = buf_1._4_4_ & 0x3f;
  }
  lVar3 = tmp_block_state._8_8_ + (ulong)buf_1._4_4_;
  Hacl_Hash_MD5_update_multi
            ((uint32_t *)&stack0xffffffffffffff98,(uint8_t *)tmp_block_state._8_8_,0);
  Hacl_Hash_MD5_update_last
            ((uint32_t *)&stack0xffffffffffffff98,uVar2 - buf_1._4_4_,
             (uint8_t *)(lVar3 - (ulong)buf_last._4_4_),buf_1._4_4_);
  Hacl_Hash_MD5_finish((uint32_t *)&stack0xffffffffffffff98,output);
  return;
}

Assistant:

void Hacl_Hash_MD5_digest(Hacl_Streaming_MD_state_32 *state, uint8_t *output)
{
  Hacl_Streaming_MD_state_32 scrut = *state;
  uint32_t *block_state = scrut.block_state;
  uint8_t *buf_ = scrut.buf;
  uint64_t total_len = scrut.total_len;
  uint32_t r;
  if (total_len % (uint64_t)64U == 0ULL && total_len > 0ULL)
  {
    r = 64U;
  }
  else
  {
    r = (uint32_t)(total_len % (uint64_t)64U);
  }
  uint8_t *buf_1 = buf_;
  uint32_t tmp_block_state[4U] = { 0U };
  memcpy(tmp_block_state, block_state, 4U * sizeof (uint32_t));
  uint32_t ite;
  if (r % 64U == 0U && r > 0U)
  {
    ite = 64U;
  }
  else
  {
    ite = r % 64U;
  }
  uint8_t *buf_last = buf_1 + r - ite;
  uint8_t *buf_multi = buf_1;
  Hacl_Hash_MD5_update_multi(tmp_block_state, buf_multi, 0U);
  uint64_t prev_len_last = total_len - (uint64_t)r;
  Hacl_Hash_MD5_update_last(tmp_block_state, prev_len_last, buf_last, r);
  Hacl_Hash_MD5_finish(tmp_block_state, output);
}